

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O2

uint8_t player_sp_attr(player *p)

{
  uint8_t uVar1;
  
  uVar1 = '\r';
  if (p->csp < p->msp) {
    uVar1 = '\x04';
    if ((int)((uint)(p->opts).hitpoint_warn * (int)p->msp) / 10 < (int)p->csp) {
      uVar1 = '\v';
    }
  }
  return uVar1;
}

Assistant:

uint8_t player_sp_attr(struct player *p)
{
	uint8_t attr;
	
	if (p->csp >= p->msp)
		attr = COLOUR_L_GREEN;
	else if (p->csp > (p->msp * p->opts.hitpoint_warn) / 10)
		attr = COLOUR_YELLOW;
	else
		attr = COLOUR_RED;
	
	return attr;
}